

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int initiate_close(quicly_conn_t *conn,int err,uint64_t frame_type,char *reason_phrase)

{
  char *in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  long in_RDI;
  uint16_t quic_error_code;
  ushort local_2a;
  char *local_28;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (*(uint *)(in_RDI + 8) < 3) {
    local_28 = in_RCX;
    if (in_RCX == (char *)0x0) {
      local_28 = "";
    }
    if (in_ESI == 0) {
      local_2a = 0;
      in_RDX = 0;
    }
    else {
      local_2a = (ushort)in_ESI;
      if ((in_ESI & 0xffff0000) != 0x20000) {
        if ((in_ESI & 0xffff0000) == 0x30000) {
          in_RDX = 0xffffffffffffffff;
        }
        else if ((in_ESI & 0xffffff00) == 0) {
          local_2a = (local_2a & 0xff) + 0x100;
        }
        else {
          local_2a = 1;
        }
      }
    }
    *(ushort *)(in_RDI + 0x670) = local_2a;
    *(undefined8 *)(in_RDI + 0x678) = in_RDX;
    *(char **)(in_RDI + 0x680) = local_28;
    local_4 = enter_close((quicly_conn_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                          (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int initiate_close(quicly_conn_t *conn, int err, uint64_t frame_type, const char *reason_phrase)
{
    uint16_t quic_error_code;

    if (conn->super.state >= QUICLY_STATE_CLOSING)
        return 0;

    if (reason_phrase == NULL)
        reason_phrase = "";

    /* convert error code to QUIC error codes */
    if (err == 0) {
        quic_error_code = 0;
        frame_type = QUICLY_FRAME_TYPE_PADDING;
    } else if (QUICLY_ERROR_IS_QUIC_TRANSPORT(err)) {
        quic_error_code = QUICLY_ERROR_GET_ERROR_CODE(err);
    } else if (QUICLY_ERROR_IS_QUIC_APPLICATION(err)) {
        quic_error_code = QUICLY_ERROR_GET_ERROR_CODE(err);
        frame_type = UINT64_MAX;
    } else if (PTLS_ERROR_GET_CLASS(err) == PTLS_ERROR_CLASS_SELF_ALERT) {
        quic_error_code = QUICLY_TRANSPORT_ERROR_TLS_ALERT_BASE + PTLS_ERROR_TO_ALERT(err);
    } else {
        quic_error_code = QUICLY_ERROR_GET_ERROR_CODE(QUICLY_TRANSPORT_ERROR_INTERNAL);
    }

    conn->egress.connection_close.error_code = quic_error_code;
    conn->egress.connection_close.frame_type = frame_type;
    conn->egress.connection_close.reason_phrase = reason_phrase;
    return enter_close(conn, 1, 0);
}